

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O2

el_action_t em_yank(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  el_action_t eVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  ulong uVar5;
  
  uVar5 = (long)(el->el_chared).c_kill.last - (long)(el->el_chared).c_kill.buf;
  if (uVar5 != 0) {
    eVar2 = '\x06';
    if ((wchar_t *)((long)(el->el_line).lastchar + uVar5) < (el->el_line).limit) {
      (el->el_chared).c_kill.mark = (el->el_line).cursor;
      c_insert(el,(wchar_t)(uVar5 >> 2));
      pwVar4 = (el->el_line).cursor;
      pwVar1 = (el->el_chared).c_kill.last;
      for (pwVar3 = (el->el_chared).c_kill.buf; pwVar3 < pwVar1; pwVar3 = pwVar3 + 1) {
        *pwVar4 = *pwVar3;
        pwVar4 = pwVar4 + 1;
      }
      eVar2 = '\x04';
      if ((el->el_state).argument == L'\x01') {
        (el->el_line).cursor = pwVar4;
      }
    }
    return eVar2;
  }
  return '\0';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_yank(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *kp, *cp;

	if (el->el_chared.c_kill.last == el->el_chared.c_kill.buf)
		return CC_NORM;

	if (el->el_line.lastchar +
	    (el->el_chared.c_kill.last - el->el_chared.c_kill.buf) >=
	    el->el_line.limit)
		return CC_ERROR;

	el->el_chared.c_kill.mark = el->el_line.cursor;

	/* open the space, */
	c_insert(el,
	    (int)(el->el_chared.c_kill.last - el->el_chared.c_kill.buf));
	cp = el->el_line.cursor;
	/* copy the chars */
	for (kp = el->el_chared.c_kill.buf; kp < el->el_chared.c_kill.last; kp++)
		*cp++ = *kp;

	/* if an arg, cursor at beginning else cursor at end */
	if (el->el_state.argument == 1)
		el->el_line.cursor = cp;

	return CC_REFRESH;
}